

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_MSR_imm(DisasContext_conflict1 *s,arg_MSR_imm *a)

{
  uint uVar1;
  byte bVar2;
  undefined1 extraout_AL;
  uint32_t mask;
  int iVar3;
  
  uVar1 = a->imm;
  bVar2 = (char)a->rot * '\x02' & 0x1f;
  iVar3 = a->r;
  mask = msr_mask(s,a->mask,iVar3);
  iVar3 = gen_set_psr_im(s,mask,iVar3,uVar1 >> bVar2 | uVar1 << 0x20 - bVar2);
  if (iVar3 != 0) {
    unallocated_encoding_aarch64(s);
    return (_Bool)extraout_AL;
  }
  return false;
}

Assistant:

static bool trans_MSR_imm(DisasContext *s, arg_MSR_imm *a)
{
    uint32_t val = ror32(a->imm, a->rot * 2);
    uint32_t mask = msr_mask(s, a->mask, a->r);

    if (gen_set_psr_im(s, mask, a->r, val)) {
        unallocated_encoding(s);
    }
    return true;
}